

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

void Abc_FlowRetime_AddInitBias(void)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  long *plVar2;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  long lVar5;
  size_t __size;
  MinRegMan_t *pMVar6;
  uint uVar7;
  int iVar8;
  Flow_Data_t *pFVar9;
  Vec_Ptr_t *pVVar10;
  uint *__ptr;
  undefined8 *puVar11;
  Vec_Int_t *p;
  int *piVar12;
  void *__ptr_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  
  pNtk = pManMR->pNtk;
  uVar17 = pManMR->vInitConstraints->nSize;
  __size = (((long)pManMR->iteration + 1) * (long)(int)uVar17 + (long)pManMR->nNodes) * 0x18;
  if (pManMR->pDataArray == (Flow_Data_t *)0x0) {
    pFVar9 = (Flow_Data_t *)malloc(__size);
  }
  else {
    pFVar9 = (Flow_Data_t *)realloc(pManMR->pDataArray,__size);
  }
  pMVar6 = pManMR;
  pManMR->pDataArray = pFVar9;
  memset(pFVar9 + pMVar6->nNodes,0,((long)pMVar6->iteration + 1) * (long)(int)uVar17 * 0x18);
  if (pMVar6->fVerbose != 0) {
    printf("\t\tcreating %d bias structures\n",(ulong)uVar17);
  }
  pVVar10 = pManMR->vInitConstraints;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      plVar2 = (long *)pVVar10->pArray[lVar14];
      if ((*plVar2 == 0) &&
         (Abc_NtkCreateObj(pNtk,ABC_OBJ_BLACKBOX), 0 < *(int *)((long)plVar2 + 0xc))) {
        lVar16 = 0;
        do {
          iVar1 = *(int *)(plVar2[2] + lVar16 * 4);
          if (((long)iVar1 < 0) || (pVVar10 = pNtk->vObjs, pVVar10->nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (*(int *)((long)plVar2 + 0x1c) <= lVar16) {
LAB_0045f17e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pObj = (Abc_Obj_t *)pVVar10->pArray[iVar1];
          iVar1 = *(int *)(plVar2[4] + lVar16 * 4);
          __ptr = (uint *)malloc(0x10);
          __ptr[0] = 8;
          __ptr[1] = 0;
          puVar11 = (undefined8 *)malloc(0x40);
          *(undefined8 **)(__ptr + 2) = puVar11;
          p = (Vec_Int_t *)malloc(0x10);
          p->nCap = 0x10;
          p->nSize = 0;
          piVar12 = (int *)malloc(0x40);
          p->pArray = piVar12;
          pAVar3 = pObj->pNtk;
          __ptr[1] = 1;
          *puVar11 = pObj;
          Vec_IntPush(p,0);
          uVar13 = extraout_RDX;
          if ((pAVar3->vTravIds).pArray == (int *)0x0) {
            iVar8 = pAVar3->vObjs->nSize;
            uVar19 = (long)iVar8 + 500;
            iVar20 = (int)uVar19;
            if ((pAVar3->vTravIds).nCap < iVar20) {
              piVar12 = (int *)malloc(uVar19 * 4);
              (pAVar3->vTravIds).pArray = piVar12;
              if (piVar12 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              (pAVar3->vTravIds).nCap = iVar20;
              uVar13 = extraout_RDX_00;
            }
            if (-500 < iVar8) {
              memset((pAVar3->vTravIds).pArray,0,(uVar19 & 0xffffffff) << 2);
              uVar13 = extraout_RDX_01;
            }
            (pAVar3->vTravIds).nSize = iVar20;
          }
          iVar8 = pAVar3->nTravIds;
          pAVar3->nTravIds = iVar8 + 1;
          if (0x3ffffffe < iVar8) {
            __assert_fail("p->nTravIds < (1<<30)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                          ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
          }
          __ptr_00 = *(void **)(__ptr + 2);
          uVar19 = 1;
          do {
            uVar17 = (uint)uVar19;
            if ((int)uVar17 < 1) {
              *(void **)(__ptr + 2) = __ptr_00;
              __ptr[1] = uVar17;
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
            }
            uVar17 = uVar17 - 1;
            uVar19 = (ulong)uVar17;
            if (p->nSize < 1) {
              *(void **)(__ptr + 2) = __ptr_00;
              __ptr[1] = uVar17;
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x396,"int Vec_IntPop(Vec_Int_t *)");
            }
            plVar4 = *(long **)((long)__ptr_00 + uVar19 * 8);
            uVar7 = p->nSize - 1;
            p->nSize = uVar7;
            uVar7 = p->pArray[uVar7];
            lVar21 = *plVar4;
            iVar8 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar21 + 0xe0),iVar8 + 1,(int)uVar13);
            if (((long)iVar8 < 0) || (*(int *)(lVar21 + 0xe4) <= iVar8)) {
              *(void **)(__ptr + 2) = __ptr_00;
              __ptr[1] = uVar17;
              goto LAB_0045f17e;
            }
            lVar5 = *plVar4;
            iVar20 = *(int *)(lVar5 + 0xd8);
            uVar13 = extraout_RDX_02;
            if (*(int *)(*(long *)(lVar21 + 0xe8) + (long)iVar8 * 4) != iVar20) {
              iVar8 = (int)plVar4[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar8 + 1,(int)extraout_RDX_02);
              if (((long)iVar8 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar8)) {
                *(void **)(__ptr + 2) = __ptr_00;
                __ptr[1] = uVar17;
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar8 * 4) = iVar20;
              uVar17 = *(uint *)((long)plVar4 + 0x14) & 0xf;
              uVar13 = extraout_RDX_03;
              if (((uVar17 != 5) && (uVar17 != 8)) &&
                 (iVar8 = Abc_FlowRetime_GetLag(pObj), uVar13 = extraout_RDX_04,
                 iVar8 + uVar7 == iVar1)) {
                *(ushort *)(pManMR->pDataArray + *(uint *)(plVar4 + 2)) =
                     *(ushort *)(pManMR->pDataArray + *(uint *)(plVar4 + 2)) | 0x10;
              }
              if (0 < *(int *)((long)plVar4 + 0x2c)) {
                lVar21 = 0;
                do {
                  lVar5 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                   (long)*(int *)(plVar4[6] + lVar21 * 4) * 8);
                  uVar17 = *(uint *)(lVar5 + 0x14) & 0xf;
                  if (((uVar17 < 9) && ((0x130U >> uVar17 & 1) != 0)) ||
                     ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 5)) {
                    uVar17 = *__ptr;
                    uVar18 = (uint)uVar19;
                    if (uVar18 == uVar17) {
                      if ((int)uVar17 < 0x10) {
                        if (__ptr_00 == (void *)0x0) {
                          __ptr_00 = malloc(0x80);
                        }
                        else {
                          __ptr_00 = realloc(__ptr_00,0x80);
                        }
                        uVar15 = 0x10;
                      }
                      else {
                        uVar15 = uVar17 * 2;
                        if ((int)uVar15 <= (int)uVar17) goto LAB_0045f088;
                        if (__ptr_00 == (void *)0x0) {
                          __ptr_00 = malloc((ulong)uVar17 << 4);
                        }
                        else {
                          __ptr_00 = realloc(__ptr_00,(ulong)uVar17 << 4);
                        }
                      }
                      *__ptr = uVar15;
                    }
LAB_0045f088:
                    uVar19 = (ulong)(uVar18 + 1);
                    *(long *)((long)__ptr_00 + (long)(int)uVar18 * 8) = lVar5;
                    Vec_IntPush(p,(uint)(uVar7 != ((*(uint *)(lVar5 + 0x14) & 0xf) == 8)));
                    uVar13 = extraout_RDX_05;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < *(int *)((long)plVar4 + 0x2c));
              }
            }
          } while ((int)uVar19 != 0);
          *(void **)(__ptr + 2) = __ptr_00;
          __ptr[1] = 0;
          if (__ptr_00 != (void *)0x0) {
            free(__ptr_00);
            __ptr[2] = 0;
            __ptr[3] = 0;
          }
          free(__ptr);
          if (p->pArray != (int *)0x0) {
            free(p->pArray);
            p->pArray = (int *)0x0;
          }
          free(p);
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)((long)plVar2 + 0xc));
      }
      lVar14 = lVar14 + 1;
      pVVar10 = pManMR->vInitConstraints;
    } while (lVar14 < pVVar10->nSize);
  }
  return;
}

Assistant:

void Abc_FlowRetime_AddInitBias( ) {
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Obj_t *pBiasNode, *pObj;
  InitConstraint_t *pConstraint;
  int i, j, id;
  const int nConstraints = Vec_PtrSize( pManMR->vInitConstraints );

  pManMR->pDataArray = ABC_REALLOC( Flow_Data_t, pManMR->pDataArray, pManMR->nNodes + (nConstraints*(pManMR->iteration+1)) );
  memset(pManMR->pDataArray + pManMR->nNodes, 0, sizeof(Flow_Data_t)*(nConstraints*(pManMR->iteration+1)));

  vprintf("\t\tcreating %d bias structures\n", nConstraints);

  Vec_PtrForEachEntry(InitConstraint_t*, pManMR->vInitConstraints, pConstraint, i ) {
    if (pConstraint->pBiasNode) continue;
    
 //   printf("\t\t\tbias %d...\n", i);
    pBiasNode = Abc_NtkCreateBlackbox( pNtk );

    Vec_IntForEachEntry( &pConstraint->vNodes, id, j ) {
      pObj = Abc_NtkObj(pNtk, id);
      Abc_FlowRetime_ConnectBiasNode(pBiasNode, pObj, Vec_IntEntry(&pConstraint->vLags, j));
    }

    // pConstraint->pBiasNode = pBiasNode;
  }
}